

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_union_suite.cpp
# Opt level: O1

void visitor_suite::test_void(void)

{
  storage_type data;
  small_union<std::allocator<char>,int,unsigned_long,bool,int> local_18 [8];
  undefined8 local_10;
  
  local_10 = 0;
  local_18[0] = (small_union<std::allocator<char>,int,unsigned_long,bool,int>)0x1;
  trial::dynamic::detail::small_union<std::allocator<char>,int,unsigned_long,bool,int>::
  call<visitor_suite::visitor_void,void>(local_18);
  trial::dynamic::detail::small_union<std::allocator<char>,int,unsigned_long,bool,int>::
  call<visitor_suite::const_visitor_void,void>(local_18);
  trial::dynamic::detail::small_union<std::allocator<char>,int,unsigned_long,bool,int>::
  call<trial::dynamic::detail::small_union<std::allocator<char>,int,unsigned_long,bool,int>::destructor,void>
            (local_18);
  return;
}

Assistant:

void test_void()
{
    storage_type data{true};
    data.call<visitor_void, void>();
    data.call<const_visitor_void, void>();
}